

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_allocFunction p_Var1;
  void *__dest;
  size_t sVar2;
  
  if (cctx->streamStage == zcss_init) {
    sVar2 = 0xffffffffffffffc0;
    if (cctx->staticSize == 0) {
      ZSTD_clearAllDicts(cctx);
      if (dictSize != 0 && dict != (void *)0x0) {
        if (dictLoadMethod != ZSTD_dlm_byRef) {
          p_Var1 = (cctx->customMem).customAlloc;
          if (p_Var1 == (ZSTD_allocFunction)0x0) {
            __dest = malloc(dictSize);
          }
          else {
            __dest = (*p_Var1)((cctx->customMem).opaque,dictSize);
          }
          if (__dest == (void *)0x0) {
            return 0xffffffffffffffc0;
          }
          memcpy(__dest,dict,dictSize);
          (cctx->localDict).dictBuffer = __dest;
          dict = __dest;
        }
        (cctx->localDict).dict = dict;
        (cctx->localDict).dictSize = dictSize;
        (cctx->localDict).dictContentType = dictContentType;
      }
      sVar2 = 0;
    }
  }
  else {
    sVar2 = 0xffffffffffffffc4;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong);
    RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                    "no malloc for static CCtx");
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_clearAllDicts(cctx);  /* in case one already exists */
    if (dict == NULL || dictSize == 0)  /* no dictionary mode */
        return 0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
        cctx->localDict.dict = dict;
    } else {
        void* dictBuffer = ZSTD_malloc(dictSize, cctx->customMem);
        RETURN_ERROR_IF(!dictBuffer, memory_allocation);
        memcpy(dictBuffer, dict, dictSize);
        cctx->localDict.dictBuffer = dictBuffer;
        cctx->localDict.dict = dictBuffer;
    }
    cctx->localDict.dictSize = dictSize;
    cctx->localDict.dictContentType = dictContentType;
    return 0;
}